

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeClearTable(Btree *p,int iTable,i64 *pnChange)

{
  int iVar1;
  BtShared *in_RDX;
  Pgno in_ESI;
  Btree *in_RDI;
  BtShared *pBt;
  i64 *in_stack_00000008;
  int rc;
  undefined4 in_stack_00000018;
  BtCursor *pExcept;
  Pgno iRoot;
  
  iRoot = 0xaaaaaaaa;
  pExcept = (BtCursor *)in_RDI->pBt;
  sqlite3BtreeEnter((Btree *)0x185c51);
  iVar1 = saveAllCursors(in_RDX,iRoot,pExcept);
  if (iVar1 == 0) {
    if (in_RDI->hasIncrblobCur != '\0') {
      invalidateIncrblobCursors(in_RDI,in_ESI,0,1);
    }
    iVar1 = clearDatabasePage((BtShared *)CONCAT44(iTable,in_stack_00000018),pnChange._4_4_,
                              (int)pnChange,in_stack_00000008);
  }
  sqlite3BtreeLeave((Btree *)0x185cb2);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeClearTable(Btree *p, int iTable, i64 *pnChange){
  int rc;
  BtShared *pBt = p->pBt;
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );

  rc = saveAllCursors(pBt, (Pgno)iTable, 0);

  if( SQLITE_OK==rc ){
    /* Invalidate all incrblob cursors open on table iTable (assuming iTable
    ** is the root of a table b-tree - if it is not, the following call is
    ** a no-op).  */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, (Pgno)iTable, 0, 1);
    }
    rc = clearDatabasePage(pBt, (Pgno)iTable, 0, pnChange);
  }
  sqlite3BtreeLeave(p);
  return rc;
}